

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS ref_migrate_to_balance(REF_GRID ref_grid)

{
  uint uVar1;
  REF_INT *new_part;
  int local_7c;
  int local_78;
  int local_74;
  REF_INT local_70;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *node_part;
  REF_INT heuristic;
  REF_INT node_per_core;
  REF_INT max_age;
  REF_INT age;
  REF_INT node;
  REF_INT npart;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  _node = ref_grid->node;
  ref_mpi = (REF_MPI)ref_grid;
  uVar1 = ref_node_synchronize_globals(_node);
  if (uVar1 == 0) {
    uVar1 = ref_node_collect_ghost_age(_node);
    if (uVar1 == 0) {
      if (*(int *)&ref_mpi[3].start_time == 0) {
        heuristic = 0;
        for (max_age = 0; max_age < _node->max; max_age = max_age + 1) {
          if (((-1 < max_age) && (max_age < _node->max)) && (-1 < _node->global[max_age])) {
            if (_node->age[max_age] < heuristic) {
              local_70 = heuristic;
            }
            else {
              local_70 = _node->age[max_age];
            }
            heuristic = local_70;
          }
        }
        node_per_core = heuristic;
        uVar1 = ref_mpi_max((REF_MPI)ref_node,&node_per_core,&heuristic,1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x6d8,"ref_migrate_to_balance",(ulong)uVar1,"mpi max");
          return uVar1;
        }
        uVar1 = ref_mpi_bcast((REF_MPI)ref_node,&heuristic,1,1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x6d9,"ref_migrate_to_balance",(ulong)uVar1,"min");
          return uVar1;
        }
        if (heuristic * 10 < 1000) {
          local_74 = 1000;
        }
        else {
          local_74 = heuristic * 10;
        }
        if ((int)(_node->old_n_global / (long)local_74) < 1) {
          local_78 = 1;
        }
        else {
          local_78 = (int)(_node->old_n_global / (long)local_74);
        }
        if (ref_node->n < local_78) {
          local_7c = ref_node->n;
        }
        else {
          local_7c = local_78;
        }
        age = local_7c;
      }
      else {
        age = ref_node->n;
      }
      if (_node->max < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x6e0,"ref_migrate_to_balance","malloc node_part of REF_INT negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        new_part = (REF_INT *)malloc((long)_node->max << 2);
        if (new_part == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x6e0,"ref_migrate_to_balance","malloc node_part of REF_INT NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (ref_private_macro_code_rss_5 = 0; ref_private_macro_code_rss_5 < _node->max;
              ref_private_macro_code_rss_5 = ref_private_macro_code_rss_5 + 1) {
            new_part[ref_private_macro_code_rss_5] = -1;
          }
          uVar1 = ref_migrate_new_part((REF_GRID)ref_mpi,age,new_part);
          if (uVar1 == 0) {
            uVar1 = ref_node_ghost_int(_node,new_part,1);
            if (uVar1 == 0) {
              if (1 < *(int *)&ref_node->age) {
                ref_mpi_stopwatch_stop((REF_MPI)ref_node,"migrate: new part");
              }
              if (*(long *)&ref_mpi[3].max_tag == 0) {
                for (max_age = 0; max_age < _node->max; max_age = max_age + 1) {
                  _node->part[max_age] = new_part[max_age];
                }
                uVar1 = ref_migrate_shufflin((REF_GRID)ref_mpi);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0x6ef,"ref_migrate_to_balance",(ulong)uVar1,"shufflin");
                  return uVar1;
                }
                ref_mpi_stopwatch_stop(*(REF_MPI *)ref_mpi,"shuffle primal");
              }
              else {
                uVar1 = ref_interp_from_part(*(REF_INTERP *)&ref_mpi[3].max_tag,new_part);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0x6e9,"ref_migrate_to_balance",(ulong)uVar1,"from part");
                  return uVar1;
                }
                ref_mpi_stopwatch_stop(*(REF_MPI *)ref_mpi,"shuffle primal back");
              }
              if (new_part != (REF_INT *)0x0) {
                free(new_part);
              }
              ref_grid_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x6e3,"ref_migrate_to_balance",(ulong)uVar1,"ghost part");
              ref_grid_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x6e2,"ref_migrate_to_balance",(ulong)uVar1,"new part");
            ref_grid_local._4_4_ = uVar1;
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x6ce,"ref_migrate_to_balance",(ulong)uVar1,"collect ghost age");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x6cd
           ,"ref_migrate_to_balance",(ulong)uVar1,"sync global nodes");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_to_balance(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT npart;
  REF_INT node, age, max_age;
  REF_INT node_per_core, heuristic;
  REF_INT *node_part;

  RSS(ref_node_synchronize_globals(ref_node), "sync global nodes");
  RSS(ref_node_collect_ghost_age(ref_node), "collect ghost age");
  if (ref_grid_partitioner_full(ref_grid)) {
    npart = ref_mpi_n(ref_mpi);
  } else {
    /* heuristic to reduce the number of active cores when over decomposed */
    max_age = 0;
    each_ref_node_valid_node(ref_node, node) {
      max_age = MAX(max_age, ref_node_age(ref_node, node));
    }
    age = max_age;
    RSS(ref_mpi_max(ref_mpi, &age, &max_age, REF_INT_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &max_age, 1, REF_INT_TYPE), "min");
    node_per_core = MAX(1000, 10 * max_age);
    heuristic = MAX(
        1, (REF_INT)(ref_node_n_global(ref_node) / (REF_GLOB)node_per_core));
    npart = MIN(ref_mpi_n(ref_mpi), heuristic);
  }

  ref_malloc_init(node_part, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  RSS(ref_migrate_new_part(ref_grid, npart, node_part), "new part");
  RSS(ref_node_ghost_int(ref_node, node_part, 1), "ghost part");
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "migrate: new part");

  if (NULL != ref_grid_interp(ref_grid)) {
    RSS(ref_interp_from_part(ref_grid_interp(ref_grid), node_part),
        "from part");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "shuffle primal back");
  } else {
    for (node = 0; node < ref_node_max(ref_node); node++)
      ref_node_part(ref_node, node) = node_part[node];

    RSS(ref_migrate_shufflin(ref_grid), "shufflin");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "shuffle primal");
  }
  ref_free(node_part);

  return REF_SUCCESS;
}